

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitPostfixUnaryExpression
          (SyntaxDumper *this,PostfixUnaryExpressionSyntax *node)

{
  ExpressionSyntax *pEVar1;
  SyntaxToken local_50;
  PostfixUnaryExpressionSyntax *local_18;
  PostfixUnaryExpressionSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (PostfixUnaryExpressionSyntax *)this;
  traverseExpression(this,(ExpressionSyntax *)node);
  pEVar1 = PostfixUnaryExpressionSyntax::expression(local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,pEVar1);
  PostfixUnaryExpressionSyntax::operatorToken(&local_50,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,local_18);
  SyntaxToken::~SyntaxToken(&local_50);
  return Skip;
}

Assistant:

virtual Action visitPostfixUnaryExpression(const PostfixUnaryExpressionSyntax* node) override
    {
        traverseExpression(node);
        nonterminal(node->expression());
        terminal(node->operatorToken(), node);
        return Action::Skip;
    }